

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.cc
# Opt level: O2

void search::movegen::addPawnMove(int from,int to,int cap,int side,MoveList *list,Board *pos)

{
  uint uVar1;
  long lVar2;
  
  uVar1 = cap << 0xe | to << 7;
  if (board::Board::RANKS[board::Board::SQ64[from]] == *(int *)((long)&PAWN_RANK + (long)side * 4))
  {
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      addCaptureMove(*(int *)(PROMOTION_PIECES + (long)side * 0x10 + lVar2 * 4) << 0x14 |
                     uVar1 | from,list,pos);
    }
    return;
  }
  addCaptureMove(uVar1 | from,list,pos);
  return;
}

Assistant:

inline void search::movegen::addPawnMove(const int from, const int to, const int cap, const int side, MoveList& list,
                                         board::Board& pos)
{
    if (board::Board::RANKS[board::Board::SQ64[from]] == PAWN_RANK[side]) {
        for (int i = 0; i < 4; i++) {
            addCaptureMove(board::Move::MOVE(from, to, cap, PROMOTION_PIECES[side][i], 0), list, pos);
        }
    }
    else {
        addCaptureMove(board::Move::MOVE(from, to, cap, board::EMPTY, 0), list, pos);
    }
}